

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEditor.cc
# Opt level: O0

void __thiscall
GraphEditorNodeExpansion::GraphEditorNodeExpansion
          (GraphEditorNodeExpansion *this,sgNodeID_t node,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *links_through)

{
  bool bVar1;
  iterator this_00;
  reference __args;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *in_RDX;
  GraphEditorOperation *in_RDI;
  pair<long,_long> *l;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *__range1;
  long *in_stack_ffffffffffffffb8;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
  local_38 [7];
  
  GraphEditorOperation::GraphEditorOperation(in_RDI);
  std::vector<long,std::allocator<long>>::emplace_back<long&>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_38[0]._M_current =
       (pair<long,_long> *)
       std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::begin(in_RDX);
  this_00 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::end(in_RDX)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
                        *)in_RDX);
    if (!bVar1) break;
    __args = __gnu_cxx::
             __normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
             ::operator*(local_38);
    std::vector<long,std::allocator<long>>::emplace_back<long&>
              ((vector<long,_std::allocator<long>_> *)this_00._M_current,&__args->first);
    std::vector<long,std::allocator<long>>::emplace_back<long&>
              ((vector<long,_std::allocator<long>_> *)this_00._M_current,&__args->first);
    __gnu_cxx::
    __normal_iterator<std::pair<long,_long>_*,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>
    ::operator++(local_38);
  }
  std::vector<long,_std::allocator<long>_>::operator=
            ((vector<long,_std::allocator<long>_> *)this,(vector<long,_std::allocator<long>_> *)node
            );
  std::vector<long,_std::allocator<long>_>::operator=
            ((vector<long,_std::allocator<long>_> *)this,(vector<long,_std::allocator<long>_> *)node
            );
  return;
}

Assistant:

GraphEditorNodeExpansion::GraphEditorNodeExpansion(sgNodeID_t node,
                                                   std::vector<std::pair<sgNodeID_t, sgNodeID_t>> links_through) {

    input_nodes.emplace_back(node);
    for (auto &l:links_through) {
        input_ends.emplace_back(l.first);
        input_ends.emplace_back(l.second);
    }
    consumed_nodes=input_nodes;
    consumed_ends=input_ends;
}